

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O2

void __thiscall
aggreports::WriteExceedanceProbabilityTable
          (aggreports *this,vector<int,_std::allocator<int>_> *fileIDs,
          map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
          *items,double max_retperiod,int epcalc,int eptype,int eptype_tvar,int samplesize)

{
  pointer pfVar1;
  mapped_type *this_00;
  code *pcVar2;
  _Rb_tree_node_base *p_Var3;
  pointer piVar4;
  long lVar5;
  long *plVar6;
  pointer pfVar7;
  float current_loss;
  double current_return_period;
  float local_e8;
  OASIS_FLOAT last_computed_loss;
  size_t nextreturnperiodindex;
  double local_d0;
  double local_c8;
  int local_c0;
  float local_bc;
  undefined1 local_b8 [16];
  double last_computed_rp;
  pair<const_int,_std::vector<float,_std::allocator<float>_>_> s;
  reverse_iterator<__gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>_>
  local_70;
  reverse_iterator<__gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>_>
  local_68;
  map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
  tail;
  
  if ((samplesize != 0) && ((items->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    tail._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &tail._M_t._M_impl.super__Rb_tree_header._M_header;
    tail._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    tail._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    tail._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_bc = (float)samplesize;
    local_c8 = max_retperiod;
    local_c0 = eptype_tvar;
    tail._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         tail._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (p_Var3 = (items->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(items->_M_t)._M_impl.super__Rb_tree_header;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>::pair
                (&s,(pair<const_int,_std::vector<float,_std::allocator<float>_>_> *)(p_Var3 + 1));
      local_68.current._M_current =
           (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
           (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
           s.second.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_70.current._M_current =
           (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
           (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
           s.second.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
      std::
      sort<std::reverse_iterator<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>>
                (&local_68,&local_70);
      pfVar1 = s.second.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
      nextreturnperiodindex = 0;
      last_computed_rp = 0.0;
      last_computed_loss = 0.0;
      local_e8 = 0.0;
      lVar5 = 1;
      for (pfVar7 = s.second.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start; pfVar7 != pfVar1; pfVar7 = pfVar7 + 1) {
        current_loss = *pfVar7 / local_bc;
        if (this->useReturnPeriodFile_ == true) {
          local_b8._0_8_ = this->WriteEPTOutput;
          local_b8._8_8_ = *(undefined8 *)&this->field_0x158;
          WriteReturnPeriodOut<std::map<int,std::vector<TVaR,std::allocator<TVaR>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<TVaR,std::allocator<TVaR>>>>>>
                    (this,fileIDs,&nextreturnperiodindex,&last_computed_rp,&last_computed_loss,
                     local_c8 / (double)lVar5,current_loss,s.first,eptype,epcalc,local_c8,(int)lVar5
                     ,local_e8,&tail,local_b8._0_8_,
                     (map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                      *)local_b8._8_8_);
          local_e8 = local_e8 - (local_e8 - current_loss) / (float)lVar5;
        }
        else {
          local_d0 = local_c8 / (double)lVar5;
          this_00 = std::
                    map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                    ::operator[](&tail,&s.first);
          local_e8 = local_e8 - (local_e8 - current_loss) / (float)lVar5;
          local_b8._0_8_ = local_d0;
          local_b8._8_4_ = local_e8;
          std::vector<TVaR,_std::allocator<TVaR>_>::emplace_back<TVaR>(this_00,(TVaR *)local_b8);
          pcVar2 = (code *)this->WriteEPTOutput;
          if (pcVar2 != (code *)0x0) {
            plVar6 = (long *)((long)&this->totalperiods_ + *(long *)&this->field_0x158);
            if (((ulong)pcVar2 & 1) != 0) {
              pcVar2 = *(code **)(pcVar2 + *plVar6 + -1);
            }
            (*pcVar2)(local_d0,current_loss,plVar6,fileIDs,s.first,epcalc,eptype);
          }
        }
        lVar5 = lVar5 + 1;
      }
      if (this->useReturnPeriodFile_ == true) {
        piVar4 = (this->returnperiods_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          current_return_period = 0.0;
          if (0 < piVar4[nextreturnperiodindex]) {
            current_return_period = local_c8 / (double)lVar5;
          }
          local_b8._0_8_ = this->WriteEPTOutput;
          local_b8._8_8_ = *(undefined8 *)&this->field_0x158;
          WriteReturnPeriodOut<std::map<int,std::vector<TVaR,std::allocator<TVaR>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<TVaR,std::allocator<TVaR>>>>>>
                    (this,fileIDs,&nextreturnperiodindex,&last_computed_rp,&last_computed_loss,
                     current_return_period,0.0,s.first,eptype,epcalc,local_c8,(int)lVar5,local_e8,
                     &tail,local_b8._0_8_,
                     (map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                      *)local_b8._8_8_);
          local_e8 = local_e8 - local_e8 / (float)lVar5;
          lVar5 = lVar5 + 1;
          piVar4 = (this->returnperiods_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        } while (nextreturnperiodindex <
                 (ulong)((long)(this->returnperiods_).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)piVar4 >> 2));
      }
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&s.second.super__Vector_base<float,_std::allocator<float>_>);
    }
    if ((this->ordFlag_ != false) && (*this->fout_ != (FILE *)0x0)) {
      WriteTVaR(this,fileIDs,epcalc,local_c0,&tail);
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
    ::~_Rb_tree(&tail._M_t);
  }
  return;
}

Assistant:

void aggreports::WriteExceedanceProbabilityTable(
	const std::vector<int> &fileIDs, std::map<int, lossvec> &items,
	const double max_retperiod, int epcalc, int eptype, int eptype_tvar,
	int samplesize) {

  if (items.size() == 0) return;
  if (samplesize == 0) return;

#ifdef ORD_OUTPUT
  if (os_ept_exists_ == false) {
  	if (parquetFileNames_[EPT] != "") {
		os_ept_ = GetParquetStreamWriter(EPT);
		os_ept_exists_ = true;
	}
  }
#endif

  std::map<int, std::vector<TVaR>> tail;

  for (auto s : items) {
    lossvec &lpv = s.second;
    std::sort(lpv.rbegin(), lpv.rend());
    size_t nextreturnperiodindex = 0;
    double last_computed_rp = 0;
    OASIS_FLOAT last_computed_loss = 0;
    OASIS_FLOAT tvar = 0;
    long i = 1;

    for (auto lp : lpv) {
      double retperiod = max_retperiod / i;

      if (useReturnPeriodFile_) {
#ifdef ORD_OUTPUT
	WriteReturnPeriodOut(fileIDs, nextreturnperiodindex, last_computed_rp,
			     last_computed_loss, retperiod, lp / samplesize,
			     s.first, eptype, epcalc, max_retperiod, i, tvar,
			     tail, WriteEPTOutput, os_ept_);
#else
	WriteReturnPeriodOut(fileIDs, nextreturnperiodindex, last_computed_rp,
			     last_computed_loss, retperiod, lp / samplesize,
			     s.first, eptype, epcalc, max_retperiod, i, tvar,
			     tail, WriteEPTOutput);
#endif
	tvar = tvar - ((tvar - (lp / samplesize)) / i);
      } else {
	tvar = tvar - ((tvar - (lp / samplesize)) / i);
	tail[s.first].push_back({retperiod, tvar});
	if (WriteEPTOutput != nullptr) {
	  (this->*WriteEPTOutput)(fileIDs, s.first, epcalc, eptype, retperiod,
				  lp / samplesize);
	}
#ifdef ORD_OUTPUT
	// TODO: Rather than checking for this on every iteration, it may be
	// more efficient to create a new class that inherits from
	// parquet::StreamWriter and implement the ios::setstate() function. In
	// this way, the state can be set to std::ios_base::badbit if needed.
	if (parquetFileNames_[EPT] != "") {
	  WriteParquetOutput(os_ept_, s.first, epcalc, eptype, retperiod,
			     lp / samplesize);
	}
#endif
      }
      i++;
    }
    if (useReturnPeriodFile_) {
      do {
	double retperiod = max_retperiod / i;
	if (returnperiods_[nextreturnperiodindex] <= 0) retperiod = 0;
#ifdef ORD_OUTPUT
	WriteReturnPeriodOut(fileIDs, nextreturnperiodindex, last_computed_rp,
			     last_computed_loss, retperiod, 0, s.first, eptype,
			     epcalc, max_retperiod, i, tvar, tail,
			     WriteEPTOutput, os_ept_);
#else
	WriteReturnPeriodOut(fileIDs, nextreturnperiodindex, last_computed_rp,
			     last_computed_loss, retperiod, 0, s.first, eptype,
			     epcalc, max_retperiod, i, tvar, tail,
			     WriteEPTOutput);
#endif
	tvar = tvar - (tvar / i);
	i++;
      } while (nextreturnperiodindex < returnperiods_.size());
    }
  }

  // Only write Tail Value at Risk (TVaR) for ORD output
  if (!ordFlag_) return;
  if (fout_[EPT] != nullptr) WriteTVaR(fileIDs, epcalc, eptype_tvar, tail);
#ifdef ORD_OUTPUT
  if (parquetFileNames_[EPT] != "") {
    WriteTVaR(os_ept_, epcalc, eptype_tvar, tail);
  }
#endif

}